

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Tree::change_type(Tree *this,size_t node,NodeType type)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  undefined1 uVar7;
  NodeData *pNVar8;
  NodeData *pNVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  byte bVar15;
  csubstr cVar16;
  char *pcStack_e8;
  size_t local_e0;
  char *pcStack_c0;
  size_t local_b8;
  char *pcStack_98;
  size_t local_90;
  char msg [64];
  
  bVar15 = 0;
  uVar11 = (uint)type.type;
  uVar14 = uVar11 & 3;
  if ((type.type & (SEQ|MAP)) == NOTYPE && uVar14 != 1) {
    builtin_strncpy(msg + 0x30," type.is_seq())",0x10);
    builtin_strncpy(msg + 0x20,"type.is_map() ||",0x10);
    builtin_strncpy(msg + 0x10,"ype.is_val() || ",0x10);
    builtin_strncpy(msg,"check failed: (t",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        uVar7 = (*pcVar2)();
        return (bool)uVar7;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar16 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_90 = cVar16.len;
    pcStack_98 = cVar16.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x658b) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x658b) << 0x40,8);
    LVar3.name.str = pcStack_98;
    LVar3.name.len = local_90;
    (*p_Var1)(msg,0x40,LVar3,(this->m_callbacks).m_user_data);
  }
  if (((uVar11 & 8) >> 3) + ((uVar11 & 4) >> 2) + (uint)(uVar14 == 1) != 1) {
    pcVar12 = "check failed: (type.is_val() + type.is_map() + type.is_seq() == 1)";
    pcVar13 = msg;
    for (lVar10 = 0x43; lVar10 != 0; lVar10 = lVar10 + -1) {
      *pcVar13 = *pcVar12;
      pcVar12 = pcVar12 + (ulong)bVar15 * -2 + 1;
      pcVar13 = pcVar13 + (ulong)bVar15 * -2 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        uVar7 = (*pcVar2)();
        return (bool)uVar7;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar16 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_b8 = cVar16.len;
    pcStack_c0 = cVar16.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x658c) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x658c) << 0x40,8);
    LVar4.name.str = pcStack_c0;
    LVar4.name.len = local_b8;
    (*p_Var1)(msg,0x43,LVar4,(this->m_callbacks).m_user_data);
  }
  pNVar8 = _p(this,node);
  if ((byte)((uVar11 & 2) >> 1) != (byte)((char)(pNVar8->m_type).type & KEY) >> 1) {
    pNVar8 = _p(this,node);
    if (((type.type & KEY) != NOTYPE) || (((pNVar8->m_type).type & KEY) == NOTYPE)) {
      pcVar12 = 
      "check failed: (type.has_key() == has_key(node) || (has_key(node) && !type.has_key()))";
      pcVar13 = msg;
      for (lVar10 = 0x56; lVar10 != 0; lVar10 = lVar10 + -1) {
        *pcVar13 = *pcVar12;
        pcVar12 = pcVar12 + (ulong)bVar15 * -2 + 1;
        pcVar13 = pcVar13 + (ulong)bVar15 * -2 + 1;
      }
      if (((byte)s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar2 = (code *)swi(3);
          uVar7 = (*pcVar2)();
          return (bool)uVar7;
        }
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar16 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_e0 = cVar16.len;
      pcStack_e8 = cVar16.str;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x658d) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x658d) << 0x40,8);
      LVar5.name.str = pcStack_e8;
      LVar5.name.len = local_e0;
      (*p_Var1)(msg,0x56,LVar5,(this->m_callbacks).m_user_data);
    }
  }
  pNVar8 = _p(this,node);
  if ((type.type & MAP) == NOTYPE) {
LAB_001ba4a6:
    if ((type.type & SEQ) != NOTYPE) {
      pNVar9 = _p(this,node);
      if (((pNVar9->m_type).type & SEQ) != NOTYPE) goto LAB_001ba4d7;
    }
    if (uVar14 == 1) {
      pNVar9 = _p(this,node);
      if (((pNVar9->m_type).type & KEYVAL) == VAL) goto LAB_001ba4d7;
    }
    (pNVar8->m_type).type = (pNVar8->m_type).type & ~(SEQ|MAP|VAL) | type.type;
    remove_children(this,node);
    bVar6 = true;
  }
  else {
    pNVar9 = _p(this,node);
    if (((pNVar9->m_type).type & MAP) == NOTYPE) goto LAB_001ba4a6;
LAB_001ba4d7:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Tree::change_type(size_t node, NodeType type)
{
    _RYML_CB_ASSERT(m_callbacks, type.is_val() || type.is_map() || type.is_seq());
    _RYML_CB_ASSERT(m_callbacks, type.is_val() + type.is_map() + type.is_seq() == 1);
    _RYML_CB_ASSERT(m_callbacks, type.has_key() == has_key(node) || (has_key(node) && !type.has_key()));
    NodeData *d = _p(node);
    if(type.is_map() && is_map(node))
        return false;
    else if(type.is_seq() && is_seq(node))
        return false;
    else if(type.is_val() && is_val(node))
        return false;
    d->m_type = (d->m_type & (~(MAP|SEQ|VAL))) | type;
    remove_children(node);
    return true;
}